

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vec4 __thiscall tcu::linearToSRGB(tcu *this,Vec4 *cl)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar4;
  
  fVar2 = linearChannelToSRGB(cl->m_data[0]);
  fVar3 = linearChannelToSRGB(cl->m_data[1]);
  VVar4.m_data[0] = linearChannelToSRGB(cl->m_data[2]);
  VVar4.m_data[1] = (float)extraout_XMM0_Db;
  fVar1 = cl->m_data[3];
  *(float *)this = fVar2;
  *(float *)(this + 4) = fVar3;
  *(float *)(this + 8) = VVar4.m_data[0];
  *(float *)(this + 0xc) = fVar1;
  VVar4.m_data[2] = fVar1;
  VVar4.m_data[3] = 0.0;
  return (Vec4)VVar4.m_data;
}

Assistant:

Vec4 linearToSRGB (const Vec4& cl)
{
	return Vec4(linearChannelToSRGB(cl[0]),
				linearChannelToSRGB(cl[1]),
				linearChannelToSRGB(cl[2]),
				cl[3]);
}